

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  byte bVar7;
  __type _Var8;
  _Ios_Openmode _Var9;
  ulong uVar10;
  istream *piVar11;
  ostream *poVar12;
  size_type sVar13;
  char *pcVar14;
  void *pvVar15;
  float *pfVar16;
  unsigned_long uVar17;
  long in_RSI;
  int in_EDI;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  Vec<3U,_float> VVar23;
  uint i;
  ofstream outfile;
  string outname;
  Array3f phi_grid;
  Vec3ui sizes;
  Vec3f unit;
  int v2;
  int v1;
  int v0;
  char c_1;
  stringstream data_1;
  Vec3f point;
  char c;
  stringstream data;
  vector<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_> faceList;
  vector<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_> vertList;
  string line;
  int ignored_lines;
  ifstream infile;
  Vec3f max_box;
  Vec3f min_box;
  int padding;
  stringstream arg3;
  float dx;
  stringstream arg2;
  string filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffee58;
  int iVar24;
  undefined4 in_stack_ffffffffffffee60;
  undefined4 uVar25;
  undefined4 in_stack_ffffffffffffee64;
  Vec<3U,_float> *in_stack_ffffffffffffee68;
  vector<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_> *in_stack_ffffffffffffee70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffee78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffee80;
  Vec<3U,_float> *in_stack_ffffffffffffee88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffee90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffee98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeea0;
  bool local_ef9;
  bool local_e71;
  uint local_e5c;
  undefined1 local_e58 [72];
  int in_stack_fffffffffffff1f0;
  int in_stack_fffffffffffff1f4;
  int in_stack_fffffffffffff1f8;
  float in_stack_fffffffffffff1fc;
  Vec3f *in_stack_fffffffffffff200;
  vector<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_> *in_stack_fffffffffffff208;
  vector<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_> *in_stack_fffffffffffff210;
  Array3f *in_stack_fffffffffffff220;
  int in_stack_fffffffffffff228;
  allocator<char> local_c51;
  string local_c50 [32];
  string local_c30 [32];
  string local_c10 [32];
  string local_bf0 [32];
  int local_bd0;
  int local_bcc;
  int local_bc8;
  Array1<float> local_bc0;
  undefined8 local_ba8;
  float local_ba0;
  undefined8 local_b98;
  float local_b90;
  undefined8 local_b88;
  float local_b80;
  undefined8 local_b78;
  float local_b70;
  undefined8 local_b60;
  float local_b58;
  undefined8 local_b50;
  float local_b48;
  undefined8 local_b40;
  float local_b38;
  undefined8 local_b30;
  float local_b28;
  undefined8 local_b20;
  float local_b18;
  undefined8 local_b10;
  float local_b08;
  undefined8 local_b00;
  float local_af8;
  undefined8 local_af0;
  float local_ae8;
  Vec<3U,_float> local_ae0;
  allocator<char> local_ad1;
  string local_ad0 [32];
  string local_ab0 [36];
  Vec<3U,_unsigned_int> local_a8c;
  int local_a80;
  int local_a7c;
  int local_a78;
  char local_a71;
  stringstream local_a70 [399];
  allocator<char> local_8e1;
  string local_8e0 [32];
  string local_8c0 [32];
  Vec<3U,_float> local_8a0;
  char local_891;
  stringstream local_890 [397];
  byte local_703;
  byte local_702;
  allocator<char> local_701;
  string local_700 [39];
  byte local_6d9;
  string local_6d8 [39];
  allocator<char> local_6b1;
  string local_6b0 [32];
  string local_690 [32];
  vector<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_> local_670;
  vector<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_> local_658;
  string local_640 [36];
  int local_61c;
  long local_618 [65];
  Vec<3U,_float> local_410;
  Vec<3U,_float> local_404;
  int local_3f8;
  allocator<char> local_3f1;
  string local_3f0 [32];
  stringstream local_3d0 [392];
  float local_248;
  allocator<char> local_241;
  string local_240 [32];
  stringstream local_220 [397];
  byte local_93;
  byte local_92;
  allocator<char> local_91;
  string local_90 [39];
  byte local_69;
  string local_68 [55];
  allocator<char> local_31;
  string local_30 [32];
  long local_10;
  int local_4;
  
  local_4 = 0;
  if (in_EDI != 4) {
    std::operator<<((ostream *)&std::cout,
                    "SDFGen - A utility for converting closed oriented triangle meshes into grid-based signed distance fields.\n"
                   );
    std::operator<<((ostream *)&std::cout,"\nThe output file format is:");
    std::operator<<((ostream *)&std::cout,"<ni> <nj> <nk>\n");
    std::operator<<((ostream *)&std::cout,"<origin_x> <origin_y> <origin_z>\n");
    std::operator<<((ostream *)&std::cout,"<dx>\n");
    std::operator<<((ostream *)&std::cout,"<value_1> <value_2> <value_3> [...]\n\n");
    std::operator<<((ostream *)&std::cout,
                    "(ni,nj,nk) are the integer dimensions of the resulting distance field.\n");
    std::operator<<((ostream *)&std::cout,
                    "(origin_x,origin_y,origin_z) is the 3D position of the grid origin.\n");
    std::operator<<((ostream *)&std::cout,"<dx> is the grid spacing.\n\n");
    std::operator<<((ostream *)&std::cout,
                    "<value_n> are the signed distance data values, in ascending order of i, then j, then k.\n"
                   );
    std::operator<<((ostream *)&std::cout,
                    "The output filename will match that of the input, with the OBJ suffix replaced with SDF.\n\n"
                   );
    std::operator<<((ostream *)&std::cout,"Usage: SDFGen <filename> <dx> <padding>\n\n");
    std::operator<<((ostream *)&std::cout,"Where:\n");
    std::operator<<((ostream *)&std::cout,
                    "\t<filename> specifies a Wavefront OBJ (text) file representing a *triangle* mesh (no quad or poly meshes allowed). File must use the suffix \".obj\".\n"
                   );
    std::operator<<((ostream *)&std::cout,
                    "\t<dx> specifies the length of grid cell in the resulting distance field.\n");
    std::operator<<((ostream *)&std::cout,
                    "\t<padding> specifies the number of cells worth of padding between the object bound box and the boundary of the distance field grid. Minimum is 1.\n\n"
                   );
    exit(-1);
  }
  local_10 = in_RSI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffeea0,(char *)in_stack_ffffffffffffee98,
             (allocator<char> *)in_stack_ffffffffffffee90);
  std::allocator<char>::~allocator(&local_31);
  uVar10 = std::__cxx11::string::size();
  local_69 = 0;
  local_92 = 0;
  local_93 = 0;
  local_e71 = true;
  if (4 < uVar10) {
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_68,(ulong)local_30);
    local_69 = 1;
    std::allocator<char>::allocator();
    local_92 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffeea0,(char *)in_stack_ffffffffffffee98,
               (allocator<char> *)in_stack_ffffffffffffee90);
    local_93 = 1;
    local_e71 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                                in_stack_ffffffffffffee58);
  }
  if ((local_93 & 1) != 0) {
    std::__cxx11::string::~string(local_90);
  }
  if ((local_92 & 1) != 0) {
    std::allocator<char>::~allocator(&local_91);
  }
  if ((local_69 & 1) != 0) {
    std::__cxx11::string::~string(local_68);
  }
  if (local_e71 != false) {
    std::operator<<((ostream *)&std::cerr,
                    "Error: Expected OBJ file with filename of the form <name>.obj.\n");
    exit(-1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffeea0,(char *)in_stack_ffffffffffffee98,
             (allocator<char> *)in_stack_ffffffffffffee90);
  _Var9 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_220,local_240,_Var9);
  std::__cxx11::string::~string(local_240);
  std::allocator<char>::~allocator(&local_241);
  std::istream::operator>>((istream *)local_220,&local_248);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffeea0,(char *)in_stack_ffffffffffffee98,
             (allocator<char> *)in_stack_ffffffffffffee90);
  _Var9 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_3d0,local_3f0,_Var9);
  std::__cxx11::string::~string(local_3f0);
  std::allocator<char>::~allocator(&local_3f1);
  std::istream::operator>>((istream *)local_3d0,&local_3f8);
  if (local_3f8 < 1) {
    local_3f8 = 1;
  }
  fVar18 = std::numeric_limits<float>::max();
  fVar19 = std::numeric_limits<float>::max();
  fVar20 = std::numeric_limits<float>::max();
  Vec<3U,_float>::Vec(&local_404,fVar18,fVar19,fVar20);
  fVar18 = std::numeric_limits<float>::max();
  fVar19 = std::numeric_limits<float>::max();
  fVar20 = std::numeric_limits<float>::max();
  Vec<3U,_float>::Vec(&local_410,-fVar18,-fVar19,-fVar20);
  std::operator<<((ostream *)&std::cout,"Reading data.\n");
  std::ifstream::ifstream(local_618,*(char **)(local_10 + 8),_S_in);
  bVar7 = std::ios::operator!((ios *)((long)local_618 + *(long *)(local_618[0] + -0x18)));
  if ((bVar7 & 1) != 0) {
    std::operator<<((ostream *)&std::cerr,"Failed to open. Terminating.\n");
    exit(-1);
  }
  local_61c = 0;
  std::__cxx11::string::string(local_640);
  std::vector<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>::vector
            ((vector<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_> *)0x106d59);
  std::vector<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>::vector
            ((vector<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_> *)0x106d66);
  while( true ) {
    while( true ) {
      while( true ) {
        bVar7 = std::ios::eof();
        if (((bVar7 ^ 0xff) & 1) == 0) {
          std::ifstream::close();
          if (0 < local_61c) {
            poVar12 = std::operator<<((ostream *)&std::cout,"Warning: ");
            poVar12 = (ostream *)std::ostream::operator<<(poVar12,local_61c);
            std::operator<<(poVar12,
                            " lines were ignored since they did not contain faces or vertices.\n");
          }
          poVar12 = std::operator<<((ostream *)&std::cout,"Read in ");
          sVar13 = std::vector<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>::size(&local_658);
          poVar12 = (ostream *)std::ostream::operator<<(poVar12,sVar13);
          poVar12 = std::operator<<(poVar12," vertices and ");
          sVar13 = std::vector<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>::size
                             (&local_670);
          poVar12 = (ostream *)std::ostream::operator<<(poVar12,sVar13);
          poVar12 = std::operator<<(poVar12," faces.");
          std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
          Vec<3U,_float>::Vec(&local_ae0,1.0,1.0,1.0);
          uVar21 = 0;
          VVar23 = operator*((float)((ulong)in_stack_ffffffffffffee90 >> 0x20),
                             in_stack_ffffffffffffee88);
          local_af8 = VVar23.v[2];
          uVar22 = 0;
          auVar6._8_8_ = uVar21;
          auVar6._0_8_ = VVar23.v._0_8_;
          local_b00 = vmovlpd_avx(auVar6);
          local_af0 = local_b00;
          local_ae8 = local_af8;
          VVar23 = Vec<3U,_float>::operator-=
                             ((Vec<3U,_float> *)in_stack_ffffffffffffee80,
                              (Vec<3U,_float> *)in_stack_ffffffffffffee78);
          local_b18 = VVar23.v[2];
          auVar5._8_8_ = uVar22;
          auVar5._0_8_ = VVar23.v._0_8_;
          local_b20 = vmovlpd_avx(auVar5);
          uVar21 = 0;
          local_b10 = local_b20;
          local_b08 = local_b18;
          VVar23 = operator*((float)((ulong)in_stack_ffffffffffffee90 >> 0x20),
                             in_stack_ffffffffffffee88);
          local_b38 = VVar23.v[2];
          uVar22 = 0;
          auVar4._8_8_ = uVar21;
          auVar4._0_8_ = VVar23.v._0_8_;
          local_b40 = vmovlpd_avx(auVar4);
          local_b30 = local_b40;
          local_b28 = local_b38;
          VVar23 = Vec<3U,_float>::operator+=
                             ((Vec<3U,_float> *)in_stack_ffffffffffffee80,
                              (Vec<3U,_float> *)in_stack_ffffffffffffee78);
          fVar18 = (float)((ulong)in_stack_ffffffffffffee78 >> 0x20);
          local_b58 = VVar23.v[2];
          uVar21 = 0;
          auVar3._8_8_ = uVar22;
          auVar3._0_8_ = VVar23.v._0_8_;
          local_b60 = vmovlpd_avx(auVar3);
          local_b50 = local_b60;
          local_b48 = local_b58;
          VVar23 = Vec<3U,_float>::operator-
                             ((Vec<3U,_float> *)in_stack_ffffffffffffee90,in_stack_ffffffffffffee88)
          ;
          local_b90 = VVar23.v[2];
          auVar2._8_8_ = uVar21;
          auVar2._0_8_ = VVar23.v._0_8_;
          local_b98 = vmovlpd_avx(auVar2);
          uVar21 = 0;
          local_b88 = local_b98;
          local_b80 = local_b90;
          VVar23 = Vec<3U,_float>::operator/((Vec<3U,_float> *)in_stack_ffffffffffffee80,fVar18);
          local_ba0 = VVar23.v[2];
          auVar1._8_8_ = uVar21;
          auVar1._0_8_ = VVar23.v._0_8_;
          local_ba8 = vmovlpd_avx(auVar1);
          local_b78 = local_ba8;
          local_b70 = local_ba0;
          Vec<3U,_unsigned_int>::Vec<float>
                    ((Vec<3U,_unsigned_int> *)in_stack_ffffffffffffee70,in_stack_ffffffffffffee68);
          std::operator<<((ostream *)&std::cout,"Bound box size: (");
          poVar12 = operator<<((ostream *)
                               CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                               (Vec<3U,_float> *)in_stack_ffffffffffffee58);
          std::operator<<(poVar12,") to (");
          poVar12 = operator<<((ostream *)
                               CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                               (Vec<3U,_float> *)in_stack_ffffffffffffee58);
          std::operator<<(poVar12,") with dimensions ");
          poVar12 = operator<<((ostream *)
                               CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                               (Vec<3U,_unsigned_int> *)in_stack_ffffffffffffee58);
          iVar24 = (int)((ulong)in_stack_ffffffffffffee58 >> 0x20);
          poVar12 = std::operator<<(poVar12,".");
          std::ostream::operator<<(poVar12,std::endl<char,std::char_traits<char>>);
          std::operator<<((ostream *)&std::cout,"Computing signed distance field.\n");
          Array3<float,_Array1<float>_>::Array3((Array3<float,_Array1<float>_> *)0x1079a3);
          Vec<3U,_unsigned_int>::operator[]
                    ((Vec<3U,_unsigned_int> *)
                     CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),iVar24);
          Vec<3U,_unsigned_int>::operator[]
                    ((Vec<3U,_unsigned_int> *)
                     CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),iVar24);
          Vec<3U,_unsigned_int>::operator[]
                    ((Vec<3U,_unsigned_int> *)
                     CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),iVar24);
          iVar24 = (int)((ulong)&local_bd0 >> 0x20);
          uVar25 = 1;
          make_level_set3(in_stack_fffffffffffff210,in_stack_fffffffffffff208,
                          in_stack_fffffffffffff200,in_stack_fffffffffffff1fc,
                          in_stack_fffffffffffff1f8,in_stack_fffffffffffff1f4,
                          in_stack_fffffffffffff1f0,in_stack_fffffffffffff220,
                          in_stack_fffffffffffff228);
          std::__cxx11::string::string(local_bf0);
          std::__cxx11::string::size();
          std::__cxx11::string::substr((ulong)local_c30,(ulong)local_30);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffeea0,(char *)in_stack_ffffffffffffee98,
                     (allocator<char> *)in_stack_ffffffffffffee90);
          std::operator+(in_stack_ffffffffffffee98,in_stack_ffffffffffffee90);
          std::__cxx11::string::operator=(local_bf0,local_c10);
          std::__cxx11::string::~string(local_c10);
          std::__cxx11::string::~string(local_c50);
          std::allocator<char>::~allocator(&local_c51);
          std::__cxx11::string::~string(local_c30);
          poVar12 = std::operator<<((ostream *)&std::cout,"Writing results to: ");
          poVar12 = std::operator<<(poVar12,local_bf0);
          std::operator<<(poVar12,"\n");
          pcVar14 = (char *)std::__cxx11::string::c_str();
          std::ofstream::ofstream(local_e58,pcVar14,_S_out);
          poVar12 = (ostream *)std::ostream::operator<<(local_e58,local_bd0);
          poVar12 = std::operator<<(poVar12," ");
          poVar12 = (ostream *)std::ostream::operator<<(poVar12,local_bcc);
          poVar12 = std::operator<<(poVar12," ");
          pvVar15 = (void *)std::ostream::operator<<(poVar12,local_bc8);
          std::ostream::operator<<(pvVar15,std::endl<char,std::char_traits<char>>);
          pfVar16 = Vec<3U,_float>::operator[]
                              ((Vec<3U,_float> *)CONCAT44(in_stack_ffffffffffffee64,uVar25),iVar24);
          poVar12 = (ostream *)std::ostream::operator<<(local_e58,*pfVar16);
          poVar12 = std::operator<<(poVar12," ");
          pfVar16 = Vec<3U,_float>::operator[]
                              ((Vec<3U,_float> *)CONCAT44(in_stack_ffffffffffffee64,uVar25),iVar24);
          poVar12 = (ostream *)std::ostream::operator<<(poVar12,*pfVar16);
          poVar12 = std::operator<<(poVar12," ");
          pfVar16 = Vec<3U,_float>::operator[]
                              ((Vec<3U,_float> *)CONCAT44(in_stack_ffffffffffffee64,uVar25),iVar24);
          pvVar15 = (void *)std::ostream::operator<<(poVar12,*pfVar16);
          std::ostream::operator<<(pvVar15,std::endl<char,std::char_traits<char>>);
          pvVar15 = (void *)std::ostream::operator<<(local_e58,local_248);
          std::ostream::operator<<(pvVar15,std::endl<char,std::char_traits<char>>);
          local_e5c = 0;
          while( true ) {
            uVar10 = (ulong)local_e5c;
            uVar17 = Array1<float>::size(&local_bc0);
            if (uVar17 <= uVar10) break;
            pfVar16 = Array1<float>::operator[](&local_bc0,(ulong)local_e5c);
            in_stack_ffffffffffffee70 =
                 (vector<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_> *)
                 std::ostream::operator<<(local_e58,*pfVar16);
            std::ostream::operator<<
                      (in_stack_ffffffffffffee70,std::endl<char,std::char_traits<char>>);
            local_e5c = local_e5c + 1;
          }
          std::ofstream::close();
          std::operator<<((ostream *)&std::cout,"Processing complete.\n");
          local_4 = 0;
          std::ofstream::~ofstream(local_e58);
          std::__cxx11::string::~string(local_bf0);
          Array3<float,_Array1<float>_>::~Array3((Array3<float,_Array1<float>_> *)0x107f3d);
          std::vector<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>::~vector
                    ((vector<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_> *)
                     in_stack_ffffffffffffee70);
          std::vector<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>::~vector
                    (in_stack_ffffffffffffee70);
          std::__cxx11::string::~string(local_640);
          std::ifstream::~ifstream(local_618);
          std::__cxx11::stringstream::~stringstream(local_3d0);
          std::__cxx11::stringstream::~stringstream(local_220);
          std::__cxx11::string::~string(local_30);
          return local_4;
        }
        std::getline<char,std::char_traits<char>,std::allocator<char>>
                  ((istream *)local_618,local_640);
        local_6d9 = 0;
        local_702 = 0;
        local_703 = 0;
        std::__cxx11::string::substr((ulong)local_690,(ulong)local_640);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffeea0,(char *)in_stack_ffffffffffffee98,
                   (allocator<char> *)in_stack_ffffffffffffee90);
        _Var8 = std::operator==(in_stack_ffffffffffffee80,in_stack_ffffffffffffee78);
        local_ef9 = false;
        if (_Var8) {
          std::__cxx11::string::substr((ulong)local_6d8,(ulong)local_640);
          local_6d9 = 1;
          std::allocator<char>::allocator();
          local_702 = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_ffffffffffffeea0,(char *)in_stack_ffffffffffffee98,
                     (allocator<char> *)in_stack_ffffffffffffee90);
          local_703 = 1;
          local_ef9 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT44(in_stack_ffffffffffffee64,
                                                  in_stack_ffffffffffffee60),
                                      in_stack_ffffffffffffee58);
        }
        if ((local_703 & 1) != 0) {
          std::__cxx11::string::~string(local_700);
        }
        if ((local_702 & 1) != 0) {
          std::allocator<char>::~allocator(&local_701);
        }
        if ((local_6d9 & 1) != 0) {
          std::__cxx11::string::~string(local_6d8);
        }
        std::__cxx11::string::~string(local_6b0);
        std::allocator<char>::~allocator(&local_6b1);
        std::__cxx11::string::~string(local_690);
        if (local_ef9 == false) break;
        _Var9 = std::operator|(_S_out,_S_in);
        std::__cxx11::stringstream::stringstream(local_890,local_640,_Var9);
        Vec<3U,_float>::Vec(&local_8a0);
        piVar11 = std::operator>>((istream *)local_890,&local_891);
        pfVar16 = Vec<3U,_float>::operator[]
                            ((Vec<3U,_float> *)
                             CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                             (int)((ulong)in_stack_ffffffffffffee58 >> 0x20));
        piVar11 = (istream *)std::istream::operator>>(piVar11,pfVar16);
        pfVar16 = Vec<3U,_float>::operator[]
                            ((Vec<3U,_float> *)
                             CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                             (int)((ulong)in_stack_ffffffffffffee58 >> 0x20));
        piVar11 = (istream *)std::istream::operator>>(piVar11,pfVar16);
        pfVar16 = Vec<3U,_float>::operator[]
                            ((Vec<3U,_float> *)
                             CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                             (int)((ulong)in_stack_ffffffffffffee58 >> 0x20));
        std::istream::operator>>(piVar11,pfVar16);
        std::vector<Vec<3U,_float>,_std::allocator<Vec<3U,_float>_>_>::push_back
                  (in_stack_ffffffffffffee70,in_stack_ffffffffffffee68);
        update_minmax<3u,float>
                  ((Vec<3U,_float> *)in_stack_ffffffffffffee80,
                   (Vec<3U,_float> *)in_stack_ffffffffffffee78,
                   (Vec<3U,_float> *)in_stack_ffffffffffffee70);
        std::__cxx11::stringstream::~stringstream(local_890);
      }
      std::__cxx11::string::substr((ulong)local_8c0,(ulong)local_640);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffeea0,(char *)in_stack_ffffffffffffee98,
                 (allocator<char> *)in_stack_ffffffffffffee90);
      _Var8 = std::operator==(in_stack_ffffffffffffee80,in_stack_ffffffffffffee78);
      std::__cxx11::string::~string(local_8e0);
      std::allocator<char>::~allocator(&local_8e1);
      std::__cxx11::string::~string(local_8c0);
      if (!_Var8) break;
      _Var9 = std::operator|(_S_out,_S_in);
      std::__cxx11::stringstream::stringstream(local_a70,local_640,_Var9);
      piVar11 = std::operator>>((istream *)local_a70,&local_a71);
      piVar11 = (istream *)std::istream::operator>>(piVar11,&local_a78);
      piVar11 = (istream *)std::istream::operator>>(piVar11,&local_a7c);
      std::istream::operator>>(piVar11,&local_a80);
      Vec<3U,_unsigned_int>::Vec(&local_a8c,local_a78 - 1,local_a7c - 1,local_a80 - 1);
      std::vector<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_>::push_back
                ((vector<Vec<3U,_unsigned_int>,_std::allocator<Vec<3U,_unsigned_int>_>_> *)
                 CONCAT44(in_stack_ffffffffffffee64,in_stack_ffffffffffffee60),
                 (value_type *)in_stack_ffffffffffffee58);
      std::__cxx11::stringstream::~stringstream(local_a70);
    }
    std::__cxx11::string::substr((ulong)local_ab0,(ulong)local_640);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffeea0,(char *)in_stack_ffffffffffffee98,
               (allocator<char> *)in_stack_ffffffffffffee90);
    _Var8 = std::operator==(in_stack_ffffffffffffee80,in_stack_ffffffffffffee78);
    std::__cxx11::string::~string(local_ad0);
    std::allocator<char>::~allocator(&local_ad1);
    std::__cxx11::string::~string(local_ab0);
    if (_Var8) break;
    local_61c = local_61c + 1;
  }
  std::operator<<((ostream *)&std::cerr,
                  "Obj-loader is not able to parse vertex normals, please strip them from the input file. \n"
                 );
  exit(-2);
}

Assistant:

int main(int argc, char* argv[]) {
  
  if(argc != 4) {
    std::cout << "SDFGen - A utility for converting closed oriented triangle meshes into grid-based signed distance fields.\n";
    std::cout << "\nThe output file format is:";
    std::cout << "<ni> <nj> <nk>\n";
    std::cout << "<origin_x> <origin_y> <origin_z>\n";
    std::cout << "<dx>\n";
    std::cout << "<value_1> <value_2> <value_3> [...]\n\n";
    
    std::cout << "(ni,nj,nk) are the integer dimensions of the resulting distance field.\n";
    std::cout << "(origin_x,origin_y,origin_z) is the 3D position of the grid origin.\n";
    std::cout << "<dx> is the grid spacing.\n\n";
    std::cout << "<value_n> are the signed distance data values, in ascending order of i, then j, then k.\n";

    std::cout << "The output filename will match that of the input, with the OBJ suffix replaced with SDF.\n\n";

    std::cout << "Usage: SDFGen <filename> <dx> <padding>\n\n";
    std::cout << "Where:\n";
    std::cout << "\t<filename> specifies a Wavefront OBJ (text) file representing a *triangle* mesh (no quad or poly meshes allowed). File must use the suffix \".obj\".\n";
    std::cout << "\t<dx> specifies the length of grid cell in the resulting distance field.\n";
    std::cout << "\t<padding> specifies the number of cells worth of padding between the object bound box and the boundary of the distance field grid. Minimum is 1.\n\n";
    
    exit(-1);
  }

  std::string filename(argv[1]);
  if(filename.size() < 5 || filename.substr(filename.size()-4) != std::string(".obj")) {
    std::cerr << "Error: Expected OBJ file with filename of the form <name>.obj.\n";
    exit(-1);
  }

  std::stringstream arg2(argv[2]);
  float dx;
  arg2 >> dx;
  
  std::stringstream arg3(argv[3]);
  int padding;
  arg3 >> padding;

  if(padding < 1) padding = 1;
  //start with a massive inside out bound box.
  Vec3f min_box(std::numeric_limits<float>::max(),std::numeric_limits<float>::max(),std::numeric_limits<float>::max()), 
    max_box(-std::numeric_limits<float>::max(),-std::numeric_limits<float>::max(),-std::numeric_limits<float>::max());
  
  std::cout << "Reading data.\n";

  std::ifstream infile(argv[1]);
  if(!infile) {
    std::cerr << "Failed to open. Terminating.\n";
    exit(-1);
  }

  int ignored_lines = 0;
  std::string line;
  std::vector<Vec3f> vertList;
  std::vector<Vec3ui> faceList;
  while(!infile.eof()) {
    std::getline(infile, line);

    //.obj files sometimes contain vertex normals indicated by "vn"
    if(line.substr(0,1) == std::string("v") && line.substr(0,2) != std::string("vn")){
      std::stringstream data(line);
      char c;
      Vec3f point;
      data >> c >> point[0] >> point[1] >> point[2];
      vertList.push_back(point);
      update_minmax(point, min_box, max_box);
    }
    else if(line.substr(0,1) == std::string("f")) {
      std::stringstream data(line);
      char c;
      int v0,v1,v2;
      data >> c >> v0 >> v1 >> v2;
      faceList.push_back(Vec3ui(v0-1,v1-1,v2-1));
    }
    else if( line.substr(0,2) == std::string("vn") ){
      std::cerr << "Obj-loader is not able to parse vertex normals, please strip them from the input file. \n";
      exit(-2); 
    }
    else {
      ++ignored_lines; 
    }
  }
  infile.close();
  
  if(ignored_lines > 0)
    std::cout << "Warning: " << ignored_lines << " lines were ignored since they did not contain faces or vertices.\n";

  std::cout << "Read in " << vertList.size() << " vertices and " << faceList.size() << " faces." << std::endl;

  //Add padding around the box.
  Vec3f unit(1,1,1);
  min_box -= padding*dx*unit;
  max_box += padding*dx*unit;
  Vec3ui sizes = Vec3ui((max_box - min_box)/dx);
  
  std::cout << "Bound box size: (" << min_box << ") to (" << max_box << ") with dimensions " << sizes << "." << std::endl;

  std::cout << "Computing signed distance field.\n";
  Array3f phi_grid;
  make_level_set3(faceList, vertList, min_box, dx, sizes[0], sizes[1], sizes[2], phi_grid);

  std::string outname;

  #ifdef HAVE_VTK
    // If compiled with VTK, we can directly output a volumetric image format instead
    //Very hackily strip off file suffix.
    outname = filename.substr(0, filename.size()-4) + std::string(".vti");
    std::cout << "Writing results to: " << outname << "\n";
    vtkSmartPointer<vtkImageData> output_volume = vtkSmartPointer<vtkImageData>::New();

    output_volume->SetDimensions(phi_grid.ni ,phi_grid.nj ,phi_grid.nk);
    output_volume->SetOrigin( phi_grid.ni*dx/2, phi_grid.nj*dx/2,phi_grid.nk*dx/2);
    output_volume->SetSpacing(dx,dx,dx);

    vtkSmartPointer<vtkFloatArray> distance = vtkSmartPointer<vtkFloatArray>::New();
    
    distance->SetNumberOfTuples(phi_grid.a.size());
    
    output_volume->GetPointData()->AddArray(distance);
    distance->SetName("Distance");

    for(unsigned int i = 0; i < phi_grid.a.size(); ++i) {
      distance->SetValue(i, phi_grid.a[i]);
    }

    vtkSmartPointer<vtkXMLImageDataWriter> writer =
    vtkSmartPointer<vtkXMLImageDataWriter>::New();
    writer->SetFileName(outname.c_str());

    #if VTK_MAJOR_VERSION <= 5
      writer->SetInput(output_volume);
    #else
      writer->SetInputData(output_volume);
    #endif
    writer->Write();

  #else
    // if VTK support is missing, default back to the original ascii file-dump.
    //Very hackily strip off file suffix.
    outname = filename.substr(0, filename.size()-4) + std::string(".sdf");
    std::cout << "Writing results to: " << outname << "\n";
    
    std::ofstream outfile( outname.c_str());
    outfile << phi_grid.ni << " " << phi_grid.nj << " " << phi_grid.nk << std::endl;
    outfile << min_box[0] << " " << min_box[1] << " " << min_box[2] << std::endl;
    outfile << dx << std::endl;
    for(unsigned int i = 0; i < phi_grid.a.size(); ++i) {
      outfile << phi_grid.a[i] << std::endl;
    }
    outfile.close();
  #endif

  std::cout << "Processing complete.\n";

return 0;
}